

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashed.h
# Opt level: O0

size_t wasm::FunctionHasher::hashFunction(Function *func)

{
  size_t sVar1;
  ExprHasher local_30;
  Function *local_10;
  Function *func_local;
  
  local_10 = func;
  std::function<bool(wasm::Expression*,unsigned_long&)>::
  function<bool(&)(wasm::Expression*,unsigned_long&),void>
            ((function<bool(wasm::Expression*,unsigned_long&)> *)&local_30,
             ExpressionAnalyzer::nothingHasher);
  sVar1 = flexibleHashFunction(func,&local_30);
  std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::~function(&local_30);
  return sVar1;
}

Assistant:

static size_t hashFunction(Function* func) {
    return flexibleHashFunction(func, ExpressionAnalyzer::nothingHasher);
  }